

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O2

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom *pAVar1;
  Atom AVar2;
  unsigned_long uVar3;
  
  AVar2 = XInternAtom(_glfw.x11.display,atomName,1);
  if (AVar2 == 0) {
LAB_0010b155:
    AVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (atomCount == uVar3) goto LAB_0010b155;
      pAVar1 = supportedAtoms + uVar3;
      uVar3 = uVar3 + 1;
    } while (*pAVar1 != AVar2);
  }
  return AVar2;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    Atom atom = XInternAtom(_glfw.x11.display, atomName, True);
    if (atom != None)
    {
        unsigned long i;

        for (i = 0;  i < atomCount;  i++)
        {
            if (supportedAtoms[i] == atom)
                return atom;
        }
    }

    return None;
}